

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

string * __thiscall
despot::to_string<std::__cxx11::string>
          (string *__return_storage_ptr__,despot *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t)

{
  ostringstream local_190 [8];
  ostringstream oss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::operator<<((ostream *)local_190,(string *)this);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(T t) {
  std::ostringstream oss;
	oss << t;
	return oss.str();
}